

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O0

void getUnscaledInfeasibilities
               (HighsOptions *options,HighsScale *scale,SimplexBasis *basis,HighsSimplexInfo *info,
               HighsInfo *highs_info)

{
  double dVar1;
  bool bVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  double *pdVar5;
  const_reference pvVar6;
  long in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  long in_RSI;
  long in_RDI;
  HighsInfo *in_R8;
  double primal_infeasibility;
  double unscaled_upper;
  double unscaled_value;
  double unscaled_lower;
  HighsInt iRow_1;
  HighsInt iCol_1;
  bool col_1;
  HighsInt iVar_1;
  HighsInt ix;
  double dual_infeasibility;
  double unscaled_dual;
  double upper;
  double lower;
  double dual;
  HighsInt iRow;
  HighsInt iCol;
  bool col;
  HighsInt iVar;
  double scale_mu;
  double *sum_dual_infeasibilities;
  double *max_dual_infeasibility;
  HighsInt *num_dual_infeasibilities;
  double *sum_primal_infeasibilities;
  double *max_primal_infeasibility;
  HighsInt *num_primal_infeasibilities;
  double dual_feasibility_tolerance;
  double primal_feasibility_tolerance;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_bc;
  int local_b8;
  undefined1 local_b1;
  int local_b0;
  int local_ac;
  double local_a8;
  double local_a0;
  double local_98;
  value_type local_90;
  value_type local_88;
  int local_80;
  int local_7c;
  undefined1 local_75;
  int local_74;
  double local_70;
  double *local_68;
  double *local_60;
  HighsInt *local_58;
  double *local_50;
  double *local_48;
  HighsInt *local_40;
  double local_38;
  double local_30;
  HighsInfo *local_28;
  long local_20;
  vector<int,_std::allocator<int>_> *local_18;
  long local_10;
  
  local_30 = *(double *)(in_RDI + 0x118);
  local_38 = *(double *)(in_RDI + 0x120);
  local_40 = &(in_R8->super_HighsInfoStruct).num_primal_infeasibilities;
  local_48 = &(in_R8->super_HighsInfoStruct).max_primal_infeasibility;
  local_50 = &(in_R8->super_HighsInfoStruct).sum_primal_infeasibilities;
  local_58 = &(in_R8->super_HighsInfoStruct).num_dual_infeasibilities;
  local_60 = &(in_R8->super_HighsInfoStruct).max_dual_infeasibility;
  local_68 = &(in_R8->super_HighsInfoStruct).sum_dual_infeasibilities;
  *local_40 = 0;
  *local_48 = 0.0;
  *local_50 = 0.0;
  *local_58 = 0;
  *local_60 = 0.0;
  *local_68 = 0.0;
  local_70 = 1.0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_74 = 0; local_74 < *(int *)(local_10 + 8) + *(int *)(local_10 + 0xc);
      local_74 = local_74 + 1) {
    pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(local_18 + 1),
                        (long)local_74);
    if (*pvVar3 != '\0') {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x48),
                          (long)local_74);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x60),
                          (long)local_74);
      if ((dVar1 != *pvVar4) || (NAN(dVar1) || NAN(*pvVar4))) {
        local_75 = local_74 < *(int *)(local_10 + 8);
        local_7c = 0;
        local_80 = 0;
        if ((bool)local_75) {
          local_7c = local_74;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x18),
                              (long)local_74);
          local_70 = 1.0 / (*pvVar4 / *(double *)(local_10 + 0x10));
        }
        else {
          local_80 = local_74 - *(int *)(local_10 + 8);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x30),
                              (long)local_80);
          local_70 = *pvVar4 * *(double *)(local_10 + 0x10);
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x18),
                            (long)local_74);
        local_88 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x48),
                            (long)local_74);
        local_90 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x60),
                            (long)local_74);
        local_98 = *pvVar4;
        local_a0 = local_88 * local_70;
        bVar2 = highs_isInfinity(-local_90);
        if ((bVar2) && (bVar2 = highs_isInfinity(local_98), bVar2)) {
          local_a8 = ABS(local_a0);
        }
        else {
          pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)(local_18 + 2),
                              (long)local_74);
          local_a8 = (double)-(int)*pvVar3 * local_a0;
        }
        if (0.0 < local_a8) {
          if (local_38 <= local_a8) {
            *local_58 = *local_58 + 1;
          }
          pdVar5 = std::max<double>(&local_a8,local_60);
          *local_60 = *pdVar5;
          *local_68 = local_a8 + *local_68;
        }
      }
    }
  }
  for (local_ac = 0; local_ac < *(int *)(local_10 + 0xc); local_ac = local_ac + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_ac);
    local_b0 = *pvVar6;
    local_b1 = local_b0 < *(int *)(local_10 + 8);
    local_b8 = 0;
    local_bc = 0;
    if ((bool)local_b1) {
      local_b8 = local_b0;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x18),
                          (long)local_b0);
      local_70 = *pvVar4;
    }
    else {
      local_bc = local_b0 - *(int *)(local_10 + 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x30),
                          (long)local_bc);
      local_70 = 1.0 / *pvVar4;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0xd8),(long)local_ac)
    ;
    local_c8 = *pvVar4 * local_70;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x108),(long)local_ac
                       );
    local_d0 = *pvVar4 * local_70;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0xf0),(long)local_ac)
    ;
    local_d8 = *pvVar4 * local_70;
    local_e0 = 0.0;
    if (local_c8 - local_30 <= local_d0) {
      if (local_d8 + local_30 < local_d0) {
        local_e0 = local_d0 - local_d8;
      }
    }
    else {
      local_e0 = local_c8 - local_d0;
    }
    if (0.0 < local_e0) {
      *local_40 = *local_40 + 1;
      pdVar5 = std::max<double>(&local_e0,local_48);
      *local_48 = *pdVar5;
      *local_50 = local_e0 + *local_50;
    }
  }
  setSolutionStatus(local_28);
  return;
}

Assistant:

void getUnscaledInfeasibilities(const HighsOptions& options,
                                const HighsScale& scale,
                                const SimplexBasis& basis,
                                const HighsSimplexInfo& info,
                                HighsInfo& highs_info) {
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;

  HighsInt& num_primal_infeasibilities = highs_info.num_primal_infeasibilities;
  double& max_primal_infeasibility = highs_info.max_primal_infeasibility;
  double& sum_primal_infeasibilities = highs_info.sum_primal_infeasibilities;
  HighsInt& num_dual_infeasibilities = highs_info.num_dual_infeasibilities;
  double& max_dual_infeasibility = highs_info.max_dual_infeasibility;
  double& sum_dual_infeasibilities = highs_info.sum_dual_infeasibilities;

  // Zero the counts of unscaled primal and dual infeasibilities
  num_primal_infeasibilities = 0;
  max_primal_infeasibility = 0;
  sum_primal_infeasibilities = 0;
  num_dual_infeasibilities = 0;
  max_dual_infeasibility = 0;
  sum_dual_infeasibilities = 0;

  double scale_mu = 1.0;
  assert(int(scale.col.size()) == scale.num_col);
  assert(int(scale.row.size()) == scale.num_row);
  for (HighsInt iVar = 0; iVar < scale.num_col + scale.num_row; iVar++) {
    // Look at the dual infeasibilities of nonbasic variables
    if (basis.nonbasicFlag_[iVar] == kNonbasicFlagFalse) continue;
    // No dual infeasibility for fixed rows and columns
    if (info.workLower_[iVar] == info.workUpper_[iVar]) continue;
    bool col = iVar < scale.num_col;
    HighsInt iCol = 0;
    HighsInt iRow = 0;
    if (col) {
      iCol = iVar;
      assert(int(scale.col.size()) > iCol);
      scale_mu = 1 / (scale.col[iCol] / scale.cost);
    } else {
      iRow = iVar - scale.num_col;
      assert(int(scale.row.size()) > iRow);
      scale_mu = scale.row[iRow] * scale.cost;
    }
    const double dual = info.workDual_[iVar];
    const double lower = info.workLower_[iVar];
    const double upper = info.workUpper_[iVar];
    const double unscaled_dual = dual * scale_mu;

    double dual_infeasibility;
    if (highs_isInfinity(-lower) && highs_isInfinity(upper)) {
      // Free: any nonzero dual value is infeasible
      dual_infeasibility = fabs(unscaled_dual);
    } else {
      // Not fixed: any dual infeasibility is given by value signed by
      // nonbasicMove. This assumes that nonbasicMove=0 for fixed
      // variables
      dual_infeasibility = -basis.nonbasicMove_[iVar] * unscaled_dual;
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= dual_feasibility_tolerance)
        num_dual_infeasibilities++;
      max_dual_infeasibility = max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibilities += dual_infeasibility;
    }
  }
  // Look at the primal infeasibilities of basic variables
  for (HighsInt ix = 0; ix < scale.num_row; ix++) {
    HighsInt iVar = basis.basicIndex_[ix];
    bool col = iVar < scale.num_col;
    HighsInt iCol = 0;
    HighsInt iRow = 0;
    if (col) {
      iCol = iVar;
      scale_mu = scale.col[iCol];
    } else {
      iRow = iVar - scale.num_col;
      scale_mu = 1 / scale.row[iRow];
    }
    double unscaled_lower = info.baseLower_[ix] * scale_mu;
    double unscaled_value = info.baseValue_[ix] * scale_mu;
    double unscaled_upper = info.baseUpper_[ix] * scale_mu;
    // @primal_infeasibility calculation
    double primal_infeasibility = 0;
    if (unscaled_value < unscaled_lower - primal_feasibility_tolerance) {
      primal_infeasibility = unscaled_lower - unscaled_value;
    } else if (unscaled_value > unscaled_upper + primal_feasibility_tolerance) {
      primal_infeasibility = unscaled_value - unscaled_upper;
    }
    if (primal_infeasibility > 0) {
      num_primal_infeasibilities++;
      max_primal_infeasibility =
          max(primal_infeasibility, max_primal_infeasibility);
      sum_primal_infeasibilities += primal_infeasibility;
    }
  }
  setSolutionStatus(highs_info);
}